

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_exit_example.cpp
# Opt level: O2

void foo5(int *a)

{
  int iVar1;
  ostream *poVar2;
  
  iVar1 = *a;
  *a = 5;
  poVar2 = std::operator<<((ostream *)&std::cout,"foo5 a = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*a);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"foo5 state_saver::dismiss");
  std::endl<char,std::char_traits<char>>(poVar2);
  *a = iVar1;
  poVar2 = std::operator<<((ostream *)&std::cout,"foo5 state_saver::restore");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"foo5 a = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*a);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void foo5(int& a) {
  MAKE_SAVER_EXIT(state_saver, a); // Custom state saver on exit.

  a = 5;
  std::cout << "foo5 a = " << a << std::endl;

  state_saver.dismiss(); // Dismiss, state will not automatically restored.
  std::cout << "foo5 state_saver::dismiss" << std::endl;

  state_saver.restore(); // Restore state.
  std::cout << "foo5 state_saver::restore" << std::endl;
  std::cout << "foo5 a = " << a << std::endl;
  // Original state will not automatically restored, on scope leave.
}